

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseBlockExpr(Parser *this)

{
  TokenType TVar1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  long *plVar7;
  long *plVar8;
  CompileContext *pCVar9;
  ParseError *__return_storage_ptr__;
  Parser *in_RSI;
  pointer __old_p;
  undefined1 auVar10 [8];
  bool bVar11;
  size_type __dnew;
  Token start;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  _Alloc_hider _Stack_a0;
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  local_78;
  TokenType local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48 [2];
  line_t local_38;
  col_t local_34;
  
  local_60 = (in_RSI->m_previous).type;
  local_58._M_allocated_capacity = (size_type)local_48;
  pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
  local_34 = (in_RSI->m_previous).col;
  local_38 = (in_RSI->m_previous).line;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  plVar7 = (long *)operator_new(0x38);
  local_a8._0_4_ = (in_RSI->m_previous).type;
  pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  _Stack_a0._M_p = (pointer)local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_a0,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
  *plVar7 = (long)&PTR__UnitExpr_00126f10;
  *(undefined4 *)(plVar7 + 1) = local_a8._0_4_;
  plVar7[2] = (long)(plVar7 + 4);
  if ((CompileContext *)_Stack_a0._M_p == (CompileContext *)local_90) {
    plVar7[4] = local_90._0_8_;
    plVar7[5] = local_90._8_8_;
  }
  else {
    plVar7[2] = (long)_Stack_a0._M_p;
    plVar7[4] = local_90._0_8_;
  }
  plVar7[3] = (long)local_98;
  *(col_t *)((long)plVar7 + 0x34) = (in_RSI->m_previous).col;
  *(line_t *)(plVar7 + 6) = (in_RSI->m_previous).line;
  if (local_60 == EQUAL_GREATER) {
    parseExpr((Parser *)local_a8);
    auVar10 = local_a8;
    (**(code **)(*plVar7 + 8))(plVar7);
  }
  else {
    auVar10 = (undefined1  [8])plVar7;
    if (local_60 == LEFT_BRACE) {
      do {
        TVar1 = (in_RSI->m_current).type;
        auVar10 = (undefined1  [8])plVar7;
        if ((TVar1 == RIGHT_BRACE) || (TVar1 == END_OF_FILE)) break;
        parseStmt((Parser *)local_b0);
        auVar3 = local_b0;
        if ((in_RSI->m_current).type == SEMICOLON) {
          advance(in_RSI);
          std::
          vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
          ::emplace_back<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>
                    ((vector<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>,std::allocator<std::unique_ptr<enact::Stmt,std::default_delete<enact::Stmt>>>>
                      *)&local_78,
                     (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)local_b0);
          bVar11 = (in_RSI->m_current).type != RIGHT_BRACE;
        }
        else {
          local_b0 = (undefined1  [8])0x0;
          if (auVar3 == (undefined1  [8])0x0) {
LAB_0010c245:
            __return_storage_ptr__ = (ParseError *)__cxa_allocate_exception(0x10);
            local_a8 = (undefined1  [8])local_98;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a8,"Expected expression or \';\' at end of block.","");
            error(__return_storage_ptr__,in_RSI,(string *)local_a8);
            __cxa_throw(__return_storage_ptr__,&ParseError::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          plVar8 = (long *)__dynamic_cast(auVar3,&Stmt::typeinfo,&ExpressionStmt::typeinfo,0);
          if (plVar8 == (long *)0x0) goto LAB_0010c245;
          auVar10 = (undefined1  [8])plVar8[1];
          plVar8[1] = 0;
          if (plVar7 != (long *)0x0) {
            (**(code **)(*plVar7 + 8))(plVar7);
          }
          (**(code **)(*plVar8 + 8))(plVar8);
          bVar11 = false;
        }
        if (local_b0 != (undefined1  [8])0x0) {
          (**(code **)((((string *)local_b0)->_M_dataplus)._M_p + 8))();
        }
        plVar7 = (long *)auVar10;
      } while (bVar11);
      local_b0 = (undefined1  [8])0x1d;
      local_a8 = (undefined1  [8])local_98;
      local_a8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)local_b0)
      ;
      local_98 = local_b0;
      builtin_strncpy((char *)((long)local_a8 + 0xd),"at end o",8);
      builtin_strncpy((char *)((long)local_a8 + 0x15),"f block.",8);
      *(undefined8 *)local_a8 = 0x6465746365707845;
      *(undefined8 *)((long)local_a8 + 8) = 0x20746120277d2720;
      _Stack_a0._M_p = (pointer)local_b0;
      *(char *)((long)local_a8 + (long)local_b0) = '\0';
      expect(in_RSI,RIGHT_BRACE,(string *)local_a8);
      if (local_a8 != (undefined1  [8])local_98) {
        operator_delete((void *)local_a8,(ulong)((long)local_98 + 1));
      }
    }
  }
  pCVar9 = (CompileContext *)operator_new(0x28);
  puVar6 = local_78.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar5 = local_78.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar4 = local_78.
           super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar9->m_source)._M_dataplus._M_p = (pointer)&PTR__BlockExpr_00126f68;
  (pCVar9->m_source)._M_string_length = (size_type)puVar4;
  (pCVar9->m_source).field_2._M_allocated_capacity = (size_type)puVar5;
  *(pointer *)((long)&(pCVar9->m_source).field_2 + 8) = puVar6;
  local_98 = (undefined1  [8])0x0;
  local_a8 = (undefined1  [8])0x0;
  _Stack_a0._M_p = (pointer)0x0;
  (pCVar9->m_options).m_filename._M_dataplus._M_p = (pointer)auVar10;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_a8);
  this->m_context = pCVar9;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector(&local_78);
  if ((undefined8 *)local_58._M_allocated_capacity != local_48) {
    operator_delete((void *)local_58._M_allocated_capacity,local_48[0] + 1);
  }
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseBlockExpr() {
        Token start = m_previous;

        std::vector<std::unique_ptr<Stmt>> body{};
        std::unique_ptr<Expr> end{std::make_unique<UnitExpr>(m_previous)};

        if (start.type == TokenType::EQUAL_GREATER) {
            end = parseExpr();
        } else if (start.type == TokenType::LEFT_BRACE) {
            while (!check(TokenType::RIGHT_BRACE) && !isAtEnd()) {
                std::unique_ptr<Stmt> current = parseStmt();

                if (consume(TokenType::SEMICOLON)) {
                    body.push_back(std::move(current));
                    if (check(TokenType::RIGHT_BRACE)) break;
                } else {
                    if (auto exprStmt = dynamic_unique_ptr_cast<ExpressionStmt>(std::move(current))) {
                        end = std::move(exprStmt->expr);
                    } else {
                        throw error("Expected expression or ';' at end of block.");
                    }
                    break;
                }
            }

            expect(TokenType::RIGHT_BRACE, "Expected '}' at end of block.");
        }

        return std::make_unique<BlockExpr>(std::move(body), std::move(end));
    }